

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::WriteLogBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  char cVar5;
  LogLevel LVar6;
  int iVar7;
  reference pvVar8;
  pointer pEVar9;
  WriteLogBindData *this_00;
  pointer pWVar10;
  string *psVar11;
  type pEVar12;
  ParameterNotResolvedException *this_01;
  BinderException *pBVar13;
  InvalidTypeException *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  pointer *__ptr;
  size_type __n;
  _Head_base<0UL,_duckdb::WriteLogBindData_*,_false> local_d8;
  Value local_d0;
  ScalarFunction *local_90;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_88;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *local_80;
  LogicalType *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_90 = bound_function;
  local_88._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
    local_d0.type_._0_8_ =
         &local_d0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"write_log takes at least one argument","");
    BinderException::BinderException(pBVar13,(string *)&local_d0);
    __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar8);
  LogicalType::LogicalType(&local_d0.type_,VARCHAR);
  bVar4 = LogicalType::operator==(&pEVar9->return_type,&local_d0.type_);
  LogicalType::~LogicalType(&local_d0.type_);
  if (!bVar4) {
    this_02 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    local_d0.type_._0_8_ =
         &local_d0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"write_log first argument must be a VARCHAR","");
    InvalidTypeException::InvalidTypeException(this_02,(string *)&local_d0);
    __cxa_throw(this_02,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = (WriteLogBindData *)operator_new(0x80);
  WriteLogBindData::WriteLogBindData(this_00);
  local_d8._M_head_impl = this_00;
  LogicalType::LogicalType(&local_d0.type_,VARCHAR);
  (local_90->super_BaseScalarFunction).return_type.id_ = local_d0.type_.id_;
  (local_90->super_BaseScalarFunction).return_type.physical_type_ = local_d0.type_.physical_type_;
  peVar2 = (local_90->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (local_90->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (local_90->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_d0.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (local_90->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_d0.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_d0.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  local_d0.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  LogicalType::~LogicalType(&local_d0.type_);
  if (8 < (ulong)((long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arguments->
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    local_78 = &(local_90->super_BaseScalarFunction).return_type;
    local_80 = &(local_90->super_BaseScalarFunction).return_type.type_info_;
    __n = 1;
    do {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,__n);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (pEVar9->super_BaseExpression)._vptr_BaseExpression;
      cVar5 = (*(code *)params[1].field_2._M_allocated_capacity)(pEVar9);
      if (cVar5 != '\0') {
        this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(this_01);
        __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      iVar7 = ::std::__cxx11::string::compare((char *)&(pEVar9->super_BaseExpression).alias);
      if (iVar7 == 0) {
        pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(pvVar8);
        ThrowIfNotConstant(pEVar12);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        if ((pEVar9->return_type).id_ != BOOLEAN) {
          pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
          local_d0.type_._0_8_ =
               &local_d0.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"write_log: \'disable_logging\' argument must be a boolean"
                     ,"");
          BinderException::BinderException(pBVar13,(string *)&local_d0);
          __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(pvVar8);
        ExpressionExecutor::EvaluateScalar(&local_d0,context,pEVar12,false);
        bVar4 = BooleanValue::Get(&local_d0);
        pWVar10 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                  ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                *)&local_d8);
        pWVar10->disable_logging = bVar4;
LAB_014ec68c:
        Value::~Value(&local_d0);
      }
      else {
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        iVar7 = ::std::__cxx11::string::compare((char *)&(pEVar9->super_BaseExpression).alias);
        if (iVar7 == 0) {
          pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar8);
          ThrowIfNotConstant(pEVar12);
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar8);
          if ((pEVar9->return_type).id_ != VARCHAR) {
            pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
            local_d0.type_._0_8_ =
                 &local_d0.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"write_log: \'scope\' argument must be a string","");
            BinderException::BinderException(pBVar13,(string *)&local_d0);
            __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar8);
          ExpressionExecutor::EvaluateScalar(&local_d0,context,pEVar12,false);
          StringValue::Get_abi_cxx11_(&local_d0);
          pWVar10 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                    ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                  *)&local_d8);
          ::std::__cxx11::string::_M_assign((string *)&pWVar10->scope);
          goto LAB_014ec68c;
        }
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        iVar7 = ::std::__cxx11::string::compare((char *)&(pEVar9->super_BaseExpression).alias);
        if (iVar7 == 0) {
          pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar8);
          ThrowIfNotConstant(pEVar12);
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar8);
          if ((pEVar9->return_type).id_ != VARCHAR) {
            pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
            local_d0.type_._0_8_ =
                 &local_d0.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"write_log: \'level\' argument must be a string","");
            BinderException::BinderException(pBVar13,(string *)&local_d0);
            __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar8);
          ExpressionExecutor::EvaluateScalar(&local_d0,context,pEVar12,false);
          psVar11 = StringValue::Get_abi_cxx11_(&local_d0);
          LVar6 = EnumUtil::FromString<duckdb::LogLevel>((psVar11->_M_dataplus)._M_p);
          pWVar10 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                    ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                  *)&local_d8);
          pWVar10->level = LVar6;
          goto LAB_014ec68c;
        }
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        iVar7 = ::std::__cxx11::string::compare((char *)&(pEVar9->super_BaseExpression).alias);
        if (iVar7 == 0) {
          pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar8);
          ThrowIfNotConstant(pEVar12);
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar8);
          if ((pEVar9->return_type).id_ != VARCHAR) {
            pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
            local_d0.type_._0_8_ =
                 &local_d0.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"write_log: \'log_type\' argument must be a string","");
            BinderException::BinderException(pBVar13,(string *)&local_d0);
            __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar8);
          ExpressionExecutor::EvaluateScalar(&local_d0,context,pEVar12,false);
          StringValue::Get_abi_cxx11_(&local_d0);
          pWVar10 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                    ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                  *)&local_d8);
          ::std::__cxx11::string::_M_assign((string *)&pWVar10->type);
          goto LAB_014ec68c;
        }
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        iVar7 = ::std::__cxx11::string::compare((char *)&(pEVar9->super_BaseExpression).alias);
        if (iVar7 != 0) {
          pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
          local_70[0] = local_60;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"write_log: Unknown argument \'%s\'","");
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar8);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar1 = (pEVar9->super_BaseExpression).alias._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar1,
                     pcVar1 + (pEVar9->super_BaseExpression).alias._M_string_length);
          StringUtil::Format<std::__cxx11::string>
                    ((string *)&local_d0,(StringUtil *)local_70,&local_50,params);
          BinderException::BinderException(pBVar13,(string *)&local_d0);
          __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        pWVar10 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                  ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                *)&local_d8);
        if (&pWVar10->return_type != &pEVar9->return_type) {
          (pWVar10->return_type).id_ = (pEVar9->return_type).id_;
          (pWVar10->return_type).physical_type_ = (pEVar9->return_type).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(pWVar10->return_type).type_info_,&(pEVar9->return_type).type_info_);
        }
        pWVar10 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                  ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                *)&local_d8);
        pWVar10->output_col = __n;
        pWVar10 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                  ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                *)&local_d8);
        if (local_78 != &pWVar10->return_type) {
          (local_90->super_BaseScalarFunction).return_type.id_ = (pWVar10->return_type).id_;
          (local_90->super_BaseScalarFunction).return_type.physical_type_ =
               (pWVar10->return_type).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (local_80,&(pWVar10->return_type).type_info_);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pWVar10 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
            ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                          *)&local_d8);
  (pWVar10->context).ptr = context;
  *(WriteLogBindData **)
   local_88._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_d8._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_88._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> WriteLogBind(ClientContext &context, ScalarFunction &bound_function,
                                      vector<unique_ptr<Expression>> &arguments) {
	if (arguments.empty()) {
		throw BinderException("write_log takes at least one argument");
	}

	if (arguments[0]->return_type != LogicalType::VARCHAR) {
		throw InvalidTypeException("write_log first argument must be a VARCHAR");
	}

	// Used to replace the actual log call with a nop: useful for benchmarking
	auto result = make_uniq<WriteLogBindData>();

	// Default return type
	bound_function.return_type = LogicalType::VARCHAR;

	for (idx_t i = 1; i < arguments.size(); i++) {
		auto &arg = arguments[i];
		if (arg->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (arg->alias == "disable_logging") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::BOOLEAN) {
				throw BinderException("write_log: 'disable_logging' argument must be a boolean");
			}
			result->disable_logging = BooleanValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg));
		} else if (arg->alias == "scope") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("write_log: 'scope' argument must be a string");
			}
			result->scope = StringValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg));
		} else if (arg->alias == "level") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("write_log: 'level' argument must be a string");
			}
			result->level =
			    EnumUtil::FromString<LogLevel>(StringValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg)));
		} else if (arg->alias == "log_type") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("write_log: 'log_type' argument must be a string");
			}
			result->type = StringValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg));
		} else if (arg->alias == "return_value") {
			result->return_type = arg->return_type;
			result->output_col = i;
			bound_function.return_type = result->return_type;
		} else {
			throw BinderException(StringUtil::Format("write_log: Unknown argument '%s'", arg->alias));
		}
	}

	result->context = context;

	return std::move(result);
}